

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                 (char *begin,char *end,
                 format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *handler)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out;
  handle handle;
  uint uVar1;
  error_handler *begin_00;
  int in_ECX;
  error_handler *this;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff88;
  undefined6 in_stack_ffffffffffffff92;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  local_68;
  undefined4 local_58;
  default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_48;
  id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  local_28;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::on_text(handler,(char *)begin_00,begin + 2);
    goto LAB_003c0375;
  }
  if (*begin_00 == (error_handler)0x7d) {
    uVar1 = basic_format_parse_context<char,_fmt::v7::detail::error_handler>::next_arg_id
                      (&handler->parse_context);
    get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
              ((format_arg *)&local_68.string,(detail *)&handler->context,
               (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
                *)(ulong)uVar1,in_ECX);
    local_48.out.container = (handler->context).out_.container;
    local_48.args = (handler->context).args_;
    local_48._9_3_ = *(undefined3 *)&(handler->context).field_0x9;
    local_48._12_4_ = *(undefined4 *)&(handler->context).field_0xc;
    local_48._16_4_ = *(undefined4 *)&(handler->context).field_0x10;
    local_48._20_4_ = *(undefined4 *)&(handler->context).field_0x14;
    local_48.loc.locale_ = (handler->context).loc_.locale_;
    switch(local_58) {
    case 1:
switchD_003c02a0_caseD_1:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
                (local_48.out,local_68.int_value);
      break;
    case 2:
switchD_003c02a0_caseD_2:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                (local_48.out,local_68.uint_value);
      break;
    case 3:
switchD_003c02a0_caseD_3:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                (local_48.out,CONCAT44(local_68.long_long_value._4_4_,local_68.int_value));
      break;
    case 4:
switchD_003c02a0_caseD_4:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                (local_48.out,CONCAT44(local_68.long_long_value._4_4_,local_68.int_value));
      break;
    case 5:
switchD_003c02a0_caseD_5:
      out.container._4_4_ = local_68.long_long_value._4_4_;
      out.container._0_4_ = local_68.int_value;
      value._10_6_ = in_stack_ffffffffffffff92;
      value._0_10_ = in_stack_ffffffffffffff88;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                ((detail *)local_48.out.container,out,(__int128)value);
      break;
    case 6:
switchD_003c02a0_caseD_6:
      value_00._10_6_ = in_stack_ffffffffffffff92;
      value_00._0_10_ = in_stack_ffffffffffffff88;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                (local_48.out,(unsigned___int128)value_00);
      break;
    case 7:
switchD_003c02a0_caseD_7:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (local_48.out,local_68.bool_value);
      break;
    case 8:
switchD_003c02a0_caseD_8:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (local_48.out,local_68.char_value);
      break;
    case 9:
switchD_003c02a0_caseD_9:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                (local_48.out,local_68.float_value);
      break;
    case 10:
switchD_003c02a0_caseD_a:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                (local_48.out,(double)CONCAT44(local_68.long_long_value._4_4_,local_68.int_value));
      break;
    case 0xb:
switchD_003c02a0_caseD_b:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                (local_48.out,
                 (longdouble)
                 CONCAT28(local_68.int128_value._8_2_,
                          CONCAT44(local_68.long_long_value._4_4_,local_68.int_value)));
      break;
    case 0xc:
switchD_003c02a0_caseD_c:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (local_48.out,(char *)CONCAT44(local_68.long_long_value._4_4_,local_68.int_value));
      break;
    case 0xd:
switchD_003c02a0_caseD_d:
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<char_const*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                ((char *)CONCAT44(local_68.long_long_value._4_4_,local_68.int_value),
                 (char *)CONCAT44(local_68.long_long_value._4_4_,local_68.int_value) +
                 CONCAT62(local_68.int128_value._10_6_,local_68.int128_value._8_2_),local_48.out);
      break;
    case 0xe:
switchD_003c02a0_caseD_e:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (local_48.out,(void *)CONCAT44(local_68.long_long_value._4_4_,local_68.int_value));
      break;
    case 0xf:
switchD_003c02a0_caseD_f:
      handle.custom_.value._4_4_ = local_68.long_long_value._4_4_;
      handle.custom_.value._0_4_ = local_68.int_value;
      handle.custom_.format._0_2_ = local_68.int128_value._8_2_;
      handle.custom_.format._2_6_ = local_68.int128_value._10_6_;
      default_arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::
      operator()(&local_48,handle);
      break;
    default:
switchD_003c02a0_default:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>(local_48.out.container);
    }
LAB_003c0375:
    return (char *)(begin_00 + 1);
  }
  local_28.arg_id = 0;
  this = begin_00;
  local_28.handler = handler;
  begin_00 = (error_handler *)
             parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&,char>&>
                       ((char *)begin_00,end,&local_28);
  if (begin_00 == (error_handler *)end) {
LAB_003c04a4:
    error_handler::on_error(this,"missing \'}\' in format string");
  }
  if (*begin_00 == (error_handler)0x3a) {
    begin_00 = (error_handler *)
               format_handler<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
               ::on_format_specs(handler,local_28.arg_id,(char *)(begin_00 + 1),end);
    if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
      error_handler::on_error((error_handler *)handler,"unknown format specifier");
    }
    goto LAB_003c0375;
  }
  if (*begin_00 != (error_handler)0x7d) goto LAB_003c04a4;
  get_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,int>
            ((format_arg *)&local_68.string,(detail *)&handler->context,
             (basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>
              *)(ulong)(uint)local_28.arg_id,in_ECX);
  local_48.out.container = (handler->context).out_.container;
  local_48.args = (handler->context).args_;
  local_48._9_3_ = *(undefined3 *)&(handler->context).field_0x9;
  local_48._12_4_ = *(undefined4 *)&(handler->context).field_0xc;
  local_48._16_4_ = *(undefined4 *)&(handler->context).field_0x10;
  local_48._20_4_ = *(undefined4 *)&(handler->context).field_0x14;
  local_48.loc.locale_ = (handler->context).loc_.locale_;
  switch(local_58) {
  case 1:
    goto switchD_003c02a0_caseD_1;
  case 2:
    goto switchD_003c02a0_caseD_2;
  case 3:
    goto switchD_003c02a0_caseD_3;
  case 4:
    goto switchD_003c02a0_caseD_4;
  case 5:
    goto switchD_003c02a0_caseD_5;
  case 6:
    goto switchD_003c02a0_caseD_6;
  case 7:
    goto switchD_003c02a0_caseD_7;
  case 8:
    goto switchD_003c02a0_caseD_8;
  case 9:
    goto switchD_003c02a0_caseD_9;
  case 10:
    goto switchD_003c02a0_caseD_a;
  case 0xb:
    goto switchD_003c02a0_caseD_b;
  case 0xc:
    goto switchD_003c02a0_caseD_c;
  case 0xd:
    goto switchD_003c02a0_caseD_d;
  case 0xe:
    goto switchD_003c02a0_caseD_e;
  case 0xf:
    goto switchD_003c02a0_caseD_f;
  default:
    goto switchD_003c02a0_default;
  }
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}